

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

void __thiscall xscript::parser::ast::next(ast *this)

{
  scanner *this_00;
  size_t sVar1;
  undefined4 uVar2;
  undefined1 auVar3 [8];
  token_t_conflict tVar4;
  token local_60;
  undefined1 auStack_48 [8];
  token token;
  
  this_00 = &this->scanner;
  do {
    tokenizer::scanner::next((token *)auStack_48,this_00);
    tVar4 = auStack_48._0_4_;
    auVar3 = auStack_48;
    switch(auStack_48._0_4_) {
    case 1:
      if ((this->cur_token).type != TK_EOF) {
switchD_0011c1a3_caseD_5:
        (this->prev_token).literal._M_str = (this->cur_token).literal._M_str;
        uVar2 = *(undefined4 *)&(this->cur_token).field_0x4;
        sVar1 = (this->cur_token).literal._M_len;
        (this->prev_token).type = (this->cur_token).type;
        *(undefined4 *)&(this->prev_token).field_0x4 = uVar2;
        (this->prev_token).literal._M_len = sVar1;
        *(undefined1 (*) [8])&this->cur_token = auStack_48;
        (this->cur_token).literal._M_len = token._0_8_;
        (this->cur_token).literal._M_str = (char *)token.literal._M_len;
      }
      return;
    case 2:
      next_line(this);
      break;
    case 3:
      while (auStack_48 = auVar3, 1 < tVar4 - TK_EOF) {
        tokenizer::scanner::next(&local_60,this_00);
        token.literal._M_len = (size_t)local_60.literal._M_str;
        auStack_48 = (undefined1  [8])local_60._0_8_;
        auVar3 = auStack_48;
        token._0_8_ = local_60.literal._M_len;
        auStack_48._0_4_ = local_60.type;
        tVar4 = auStack_48._0_4_;
        if (auStack_48._0_4_ == TK_EOL) {
          auStack_48 = auVar3;
          next_line(this);
          tVar4 = auStack_48._0_4_;
          auVar3 = auStack_48;
        }
      }
      break;
    case 4:
      while (auStack_48 = auVar3, (tVar4 | TK_COMMENT_BEGIN) != TK_COMMENT_END) {
        tokenizer::scanner::next(&local_60,this_00);
        token.literal._M_len = (size_t)local_60.literal._M_str;
        auStack_48 = (undefined1  [8])local_60._0_8_;
        auVar3 = auStack_48;
        token._0_8_ = local_60.literal._M_len;
        auStack_48._0_4_ = local_60.type;
        tVar4 = auStack_48._0_4_;
        if (auStack_48._0_4_ == TK_EOL) {
          auStack_48 = auVar3;
          next_line(this);
          tVar4 = auStack_48._0_4_;
          auVar3 = auStack_48;
        }
      }
      break;
    default:
      goto switchD_0011c1a3_caseD_5;
    case 6:
    case 7:
      break;
    }
  } while( true );
}

Assistant:

void ast::next() {
    while (true) {
        tokenizer::token token = scanner.next();
        switch (token.type) {
            case tokenizer::TK_SPACE:
            case tokenizer::TK_TAB:
                // 忽略空格与制表符
                break;
            case tokenizer::TK_COMMENT_LINE:
                // 跳过单行注释
                while (token != tokenizer::TK_EOF && token != tokenizer::TK_EOL) {
                    token = scanner.next();
                    if (token == tokenizer::TK_EOL) {
                        next_line();
                    }
                }
                break;
            case tokenizer::TK_COMMENT_BEGIN:
                // 跳过多行注释
                while (token != tokenizer::TK_EOF && token != tokenizer::TK_COMMENT_END) {
                    token = scanner.next();
                    if (token == tokenizer::TK_EOL) {
                        next_line();
                    }
                }
                break;
            case tokenizer::TK_EOL:
                // 忽略换行
                next_line();
                break;
            case tokenizer::TK_EOF:
                // 扫描结束
                if (cur_token == tokenizer::TK_EOF) {
                    return;
                }
            default:
                prev_token = cur_token;
                cur_token = token;
                return;
        }
    }
}